

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-mon-list.c
# Opt level: O0

void monster_list_format_textblock
               (monster_list_t *list,textblock *tb,wchar_t max_lines,wchar_t max_width,
               size_t *max_height_result,size_t *max_width_result)

{
  short sVar1;
  _Bool _Var2;
  wchar_t wVar3;
  size_t local_60;
  wchar_t local_58;
  ulong uStack_50;
  _Bool show_others;
  size_t max_esp_line;
  size_t max_los_line;
  wchar_t esp_lines_to_display;
  wchar_t los_lines_to_display;
  wchar_t lines_remaining;
  wchar_t header_lines;
  size_t *max_width_result_local;
  size_t *max_height_result_local;
  wchar_t max_width_local;
  wchar_t max_lines_local;
  textblock *tb_local;
  monster_list_t *list_local;
  
  los_lines_to_display = L'\x01';
  max_esp_line = 0;
  uStack_50 = 0;
  if (((list != (monster_list_t *)0x0) && (list->entries != (monster_list_entry_t *)0x0)) &&
     (_lines_remaining = max_width_result, max_width_result_local = max_height_result,
     max_height_result_local._0_4_ = max_width, max_height_result_local._4_4_ = max_lines,
     _max_width_local = tb, tb_local = (textblock *)list,
     _Var2 = monster_list_format_special
                       (list,tb,max_lines,max_width,max_height_result,max_width_result), !_Var2)) {
    max_los_line._4_4_ = (wchar_t)*(ushort *)((long)&tb_local->size + 2);
    max_los_line._0_4_ = (wchar_t)*(ushort *)((long)&tb_local->size + 4);
    if (*(short *)((long)&tb_local->size + 4) != 0) {
      los_lines_to_display = los_lines_to_display + L'\x02';
    }
    if (max_width_result_local != (size_t *)0x0) {
      *max_width_result_local =
           (long)(los_lines_to_display + max_los_line._4_4_ + (wchar_t)max_los_line);
    }
    esp_lines_to_display =
         (max_height_result_local._4_4_ - los_lines_to_display) -
         (uint)*(ushort *)((long)&tb_local->size + 2);
    if (esp_lines_to_display < (int)(uint)*(ushort *)((long)&tb_local->size + 4)) {
      if (esp_lines_to_display + L'\xffffffff' < 0) {
        local_58 = L'\0';
      }
      else {
        local_58 = esp_lines_to_display + L'\xffffffff';
      }
      max_los_line._0_4_ = local_58;
    }
    if (esp_lines_to_display < L'\0') {
      wVar3 = esp_lines_to_display;
      if (esp_lines_to_display < L'\x01') {
        wVar3 = -esp_lines_to_display;
      }
      max_los_line._4_4_ = ((uint)*(ushort *)((long)&tb_local->size + 2) - wVar3) + L'\xffffffff';
    }
    if (max_height_result_local._4_4_ <= los_lines_to_display) {
      max_los_line._4_4_ = L'\0';
      max_los_line._0_4_ = L'\0';
    }
    monster_list_format_section
              ((monster_list_t *)tb_local,_max_width_local,MONSTER_LIST_SECTION_LOS,
               max_los_line._4_4_,(wchar_t)max_height_result_local,"You can see",false,&max_esp_line
              );
    if (*(short *)((long)&tb_local->size + 4) != 0) {
      sVar1 = *(short *)((long)&tb_local->size + 6);
      if (_max_width_local != (textblock *)0x0) {
        textblock_append(_max_width_local,"\n");
      }
      monster_list_format_section
                ((monster_list_t *)tb_local,_max_width_local,MONSTER_LIST_SECTION_ESP,
                 (wchar_t)max_los_line,(wchar_t)max_height_result_local,"You are aware of",
                 sVar1 != 0,&stack0xffffffffffffffb0);
    }
    if (_lines_remaining != (size_t *)0x0) {
      if (max_esp_line < uStack_50) {
        local_60 = uStack_50;
      }
      else {
        local_60 = max_esp_line;
      }
      *_lines_remaining = local_60;
    }
  }
  return;
}

Assistant:

static void monster_list_format_textblock(const monster_list_t *list, textblock *tb, int max_lines, int max_width, size_t *max_height_result, size_t *max_width_result)
{
	int header_lines = 1;
	int lines_remaining;
	int los_lines_to_display;
	int esp_lines_to_display;
	size_t max_los_line = 0;
	size_t max_esp_line = 0;

	if (list == NULL || list->entries == NULL)
		return;

	if (monster_list_format_special(list, tb, max_lines, max_width,
									max_height_result, max_width_result))
		return;

	los_lines_to_display = list->total_entries[MONSTER_LIST_SECTION_LOS];
	esp_lines_to_display = list->total_entries[MONSTER_LIST_SECTION_ESP];

	if (list->total_entries[MONSTER_LIST_SECTION_ESP] > 0)
		header_lines += 2;

	if (max_height_result != NULL)
		*max_height_result = header_lines + los_lines_to_display +
			esp_lines_to_display;

	lines_remaining = max_lines - header_lines -
		list->total_entries[MONSTER_LIST_SECTION_LOS];

	/* Remove ESP lines as needed. */
	if (lines_remaining < list->total_entries[MONSTER_LIST_SECTION_ESP])
		esp_lines_to_display = MAX(lines_remaining - 1, 0);

	/* If we don't even have enough room for the ESP header, start removing
	 * LOS lines, leaving one for the "...others". */
	if (lines_remaining < 0)
		los_lines_to_display = list->total_entries[MONSTER_LIST_SECTION_LOS] -
			abs(lines_remaining) - 1;

	/* Display only headers if we don't have enough space. */
	if (header_lines >= max_lines) {
		los_lines_to_display = 0;
		esp_lines_to_display = 0;
	}

	monster_list_format_section(list, tb, MONSTER_LIST_SECTION_LOS,
								los_lines_to_display, max_width,
								"You can see", false, &max_los_line);

	if (list->total_entries[MONSTER_LIST_SECTION_ESP] > 0) {
		bool show_others = list->total_monsters[MONSTER_LIST_SECTION_LOS] > 0;

		if (tb != NULL)
			textblock_append(tb, "\n");

		monster_list_format_section(list, tb, MONSTER_LIST_SECTION_ESP,
									esp_lines_to_display, max_width,
									"You are aware of", show_others,
									&max_esp_line);
	}

	if (max_width_result != NULL)
		*max_width_result = MAX(max_los_line, max_esp_line);
}